

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O2

int run_test_handle_fileno(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_13;
  uv_os_fd_t fd;
  int64_t eval_b_18;
  uv_tty_t tty;
  uv_pipe_t pipe;
  sockaddr_in addr;
  uv_idle_t idle;
  uv_udp_t udp;
  uv_tcp_t tcp;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  pvVar3 = (void *)(long)iVar1;
  pipe.data = (void *)0x0;
  tty.data = pvVar3;
  if (pvVar3 == (void *)0x0) {
    iVar1 = uv_idle_init(uVar2,&idle);
    pvVar3 = (void *)(long)iVar1;
    pipe.data = (void *)0x0;
    tty.data = pvVar3;
    if (pvVar3 == (void *)0x0) {
      iVar1 = uv_fileno(&idle,&fd);
      pvVar3 = (void *)(long)iVar1;
      pipe.data = (void *)0xffffffffffffffea;
      tty.data = pvVar3;
      if (pvVar3 == (void *)0xffffffffffffffea) {
        uv_close(&idle,0);
        iVar1 = uv_tcp_init(uVar2,&tcp);
        pvVar3 = (void *)(long)iVar1;
        pipe.data = (void *)0x0;
        tty.data = pvVar3;
        if (pvVar3 == (void *)0x0) {
          iVar1 = uv_fileno(&tcp,&fd);
          pvVar3 = (void *)(long)iVar1;
          pipe.data = (void *)0xfffffffffffffff7;
          tty.data = pvVar3;
          if (pvVar3 == (void *)0xfffffffffffffff7) {
            iVar1 = uv_tcp_bind(&tcp,&addr,0);
            pvVar3 = (void *)(long)iVar1;
            pipe.data = (void *)0x0;
            tty.data = pvVar3;
            if (pvVar3 == (void *)0x0) {
              iVar1 = uv_fileno(&tcp,&fd);
              pvVar3 = (void *)(long)iVar1;
              pipe.data = (void *)0x0;
              tty.data = pvVar3;
              if (pvVar3 == (void *)0x0) {
                uv_close(&tcp,0);
                iVar1 = uv_fileno(&tcp,&fd);
                pvVar3 = (void *)(long)iVar1;
                pipe.data = (void *)0xfffffffffffffff7;
                tty.data = pvVar3;
                if (pvVar3 == (void *)0xfffffffffffffff7) {
                  iVar1 = uv_udp_init(uVar2,&udp);
                  pvVar3 = (void *)(long)iVar1;
                  pipe.data = (void *)0x0;
                  tty.data = pvVar3;
                  if (pvVar3 == (void *)0x0) {
                    iVar1 = uv_fileno(&udp,&fd);
                    pvVar3 = (void *)(long)iVar1;
                    pipe.data = (void *)0xfffffffffffffff7;
                    tty.data = pvVar3;
                    if (pvVar3 == (void *)0xfffffffffffffff7) {
                      iVar1 = uv_udp_bind(&udp,&addr,0);
                      pvVar3 = (void *)(long)iVar1;
                      pipe.data = (void *)0x0;
                      tty.data = pvVar3;
                      if (pvVar3 == (void *)0x0) {
                        iVar1 = uv_fileno(&udp,&fd);
                        pvVar3 = (void *)(long)iVar1;
                        pipe.data = (void *)0x0;
                        tty.data = pvVar3;
                        if (pvVar3 == (void *)0x0) {
                          uv_close(&udp,0);
                          iVar1 = uv_fileno(&udp,&fd);
                          pvVar3 = (void *)(long)iVar1;
                          pipe.data = (void *)0xfffffffffffffff7;
                          tty.data = pvVar3;
                          if (pvVar3 == (void *)0xfffffffffffffff7) {
                            iVar1 = uv_pipe_init(uVar2,&pipe,0);
                            tty.data = (void *)(long)iVar1;
                            eval_b_13 = 0;
                            if (tty.data == (void *)0x0) {
                              iVar1 = uv_fileno(&pipe,&fd);
                              tty.data = (void *)(long)iVar1;
                              eval_b_13 = -9;
                              if (tty.data == (void *)0xfffffffffffffff7) {
                                iVar1 = uv_pipe_bind(&pipe,"/tmp/uv-test-sock");
                                tty.data = (void *)(long)iVar1;
                                eval_b_13 = 0;
                                if (tty.data == (void *)0x0) {
                                  iVar1 = uv_fileno(&pipe,&fd);
                                  tty.data = (void *)(long)iVar1;
                                  eval_b_13 = 0;
                                  if (tty.data == (void *)0x0) {
                                    uv_close(&pipe,0);
                                    iVar1 = uv_fileno(&pipe);
                                    tty.data = (void *)(long)iVar1;
                                    eval_b_13 = -9;
                                    if (tty.data == (void *)0xfffffffffffffff7) {
                                      iVar1 = open64("/dev/tty",0,0);
                                      if (iVar1 == -1) {
                                        fwrite("Cannot open a TTY fd",0x14,1,_stderr);
                                        fflush(_stderr);
                                      }
                                      else {
                                        iVar1 = uv_tty_init(uVar2,&tty,iVar1,0);
                                        pvVar3 = (void *)(long)iVar1;
                                        eval_b_18 = 0;
                                        if (pvVar3 != (void *)0x0) {
                                          pcVar5 = "0";
                                          pcVar4 = "r";
                                          uVar2 = 0x69;
                                          eval_b_13 = eval_b_18;
                                          goto LAB_00145280;
                                        }
                                        iVar1 = uv_is_readable(&tty);
                                        if (iVar1 == 0) {
                                          pcVar4 = "uv_is_readable((uv_stream_t*) &tty)";
                                          uVar2 = 0x6a;
LAB_001453fa:
                                          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                                                  ,uVar2,pcVar4);
                                          abort();
                                        }
                                        iVar1 = uv_is_writable(&tty);
                                        if (iVar1 != 0) {
                                          pcVar4 = "!uv_is_writable((uv_stream_t*) &tty)";
                                          uVar2 = 0x6b;
                                          goto LAB_001453fa;
                                        }
                                        iVar1 = uv_fileno(&tty,&fd);
                                        pvVar3 = (void *)(long)iVar1;
                                        eval_b_18 = 0;
                                        if (pvVar3 != (void *)0x0) {
                                          pcVar5 = "0";
                                          pcVar4 = "r";
                                          uVar2 = 0x6d;
                                          eval_b_13 = eval_b_18;
                                          goto LAB_00145280;
                                        }
                                        uv_close(&tty,0);
                                        iVar1 = uv_fileno(&tty,&fd);
                                        pvVar3 = (void *)(long)iVar1;
                                        eval_b_18 = -9;
                                        if (pvVar3 != (void *)0xfffffffffffffff7) {
                                          pcVar5 = "UV_EBADF";
                                          pcVar4 = "r";
                                          uVar2 = 0x70;
                                          eval_b_13 = eval_b_18;
                                          goto LAB_00145280;
                                        }
                                        iVar1 = uv_is_readable(&tty);
                                        if (iVar1 != 0) {
                                          pcVar4 = "!uv_is_readable((uv_stream_t*) &tty)";
                                          uVar2 = 0x71;
                                          goto LAB_001453fa;
                                        }
                                        iVar1 = uv_is_writable(&tty);
                                        if (iVar1 != 0) {
                                          pcVar4 = "!uv_is_writable((uv_stream_t*) &tty)";
                                          uVar2 = 0x72;
                                          goto LAB_001453fa;
                                        }
                                      }
                                      uv_run(uVar2,0);
                                      uv_walk(uVar2,close_walk_cb,0);
                                      uv_run(uVar2,0);
                                      eval_b_13 = 0;
                                      iVar1 = uv_loop_close(uVar2);
                                      eval_b_18 = (int64_t)iVar1;
                                      if ((void *)eval_b_18 == (void *)0x0) {
                                        uv_library_shutdown();
                                        return 0;
                                      }
                                      pcVar5 = "uv_loop_close(loop)";
                                      pcVar4 = "0";
                                      uVar2 = 0x77;
                                      pvVar3 = (void *)eval_b_13;
                                      eval_b_13 = eval_b_18;
                                      goto LAB_00145280;
                                    }
                                    pcVar5 = "UV_EBADF";
                                    uVar2 = 0x61;
                                  }
                                  else {
                                    pcVar5 = "0";
                                    uVar2 = 0x5e;
                                  }
                                }
                                else {
                                  pcVar5 = "0";
                                  uVar2 = 0x5c;
                                }
                              }
                              else {
                                pcVar5 = "UV_EBADF";
                                uVar2 = 0x5a;
                              }
                            }
                            else {
                              pcVar5 = "0";
                              uVar2 = 0x58;
                            }
                            pcVar4 = "r";
                            pvVar3 = tty.data;
                          }
                          else {
                            pcVar5 = "UV_EBADF";
                            pcVar4 = "r";
                            uVar2 = 0x55;
                            eval_b_13 = (int64_t)pipe.data;
                          }
                        }
                        else {
                          pcVar5 = "0";
                          pcVar4 = "r";
                          uVar2 = 0x52;
                          eval_b_13 = (int64_t)pipe.data;
                        }
                      }
                      else {
                        pcVar5 = "0";
                        pcVar4 = "r";
                        uVar2 = 0x50;
                        eval_b_13 = (int64_t)pipe.data;
                      }
                    }
                    else {
                      pcVar5 = "UV_EBADF";
                      pcVar4 = "r";
                      uVar2 = 0x4e;
                      eval_b_13 = (int64_t)pipe.data;
                    }
                  }
                  else {
                    pcVar5 = "0";
                    pcVar4 = "r";
                    uVar2 = 0x4c;
                    eval_b_13 = (int64_t)pipe.data;
                  }
                }
                else {
                  pcVar5 = "UV_EBADF";
                  pcVar4 = "r";
                  uVar2 = 0x49;
                  eval_b_13 = (int64_t)pipe.data;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "r";
                uVar2 = 0x46;
                eval_b_13 = (int64_t)pipe.data;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "r";
              uVar2 = 0x44;
              eval_b_13 = (int64_t)pipe.data;
            }
          }
          else {
            pcVar5 = "UV_EBADF";
            pcVar4 = "r";
            uVar2 = 0x42;
            eval_b_13 = (int64_t)pipe.data;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar2 = 0x40;
          eval_b_13 = (int64_t)pipe.data;
        }
      }
      else {
        pcVar5 = "UV_EINVAL";
        pcVar4 = "r";
        uVar2 = 0x3c;
        eval_b_13 = (int64_t)pipe.data;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar2 = 0x3a;
      eval_b_13 = (int64_t)pipe.data;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0x37;
    eval_b_13 = (int64_t)pipe.data;
  }
LAB_00145280:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
          ,uVar2,pcVar4,"==",pcVar5,pvVar3,"==",eval_b_13);
  abort();
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  uv_os_fd_t tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT_EQ(r, UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd == (uv_os_fd_t)-1) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT_OK(r);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_OK(r);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_EQ(r, UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}